

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

int main(int argc,char **argv)

{
  testDesc *ptVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int iVar4;
  undefined4 *puVar5;
  char *pcVar6;
  int *piVar7;
  undefined1 *puVar8;
  char *pcVar9;
  undefined8 extraout_RDX;
  long lVar10;
  char *pcVar11;
  testDesc *ptVar12;
  char *unaff_R14;
  ulong uVar13;
  bool bVar14;
  stat64 sStack_210;
  ulong uStack_180;
  char *pcStack_178;
  stat64 *psStack_170;
  code *pcStack_168;
  int iStack_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  char *pcStack_148;
  glob64_t gStack_140;
  stat64 sStack_f8;
  char **ppcStack_68;
  
  puVar5 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar5 = 0;
  xmlPedanticParserDefault(0);
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlSetExternalEntityLoader(testExternalEntityLoader);
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler);
  iVar3 = 0x102cf8;
  iVar2 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar2 < 0) {
    main_cold_1();
    iStack_14c = nb_errors;
    iStack_154 = nb_tests;
    iStack_150 = nb_leaks;
    ppcStack_68 = argv;
    if ((tests_quiet == '\0') && (testDescriptions[iVar3].desc != (char *)0x0)) {
      pcStack_168 = (code *)0x102666;
      printf("## %s\n");
    }
    if (testDescriptions[iVar3].in == (char *)0x0) {
      testErrorsSize = 0;
      testErrors[0] = '\0';
      extraMemoryFromResolver = 0;
      pcStack_168 = (code *)0x102923;
      iVar2 = (*testDescriptions[iVar3].func)
                        ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[iVar3].options);
      if (iVar2 != 0) {
        nb_errors = nb_errors + 1;
      }
    }
    else {
      gStack_140.gl_offs = 0;
      pcStack_168 = (code *)0x10269f;
      glob64(testDescriptions[iVar3].in,8,(__errfunc *)0x0,&gStack_140);
      if (gStack_140.gl_pathc != 0) {
        uVar13 = 0;
        iStack_158 = 0;
        do {
          pcStack_168 = (code *)0x1026cf;
          iVar2 = stat64(gStack_140.gl_pathv[uVar13],&sStack_f8);
          if ((iVar2 != -1) && ((sStack_f8.st_mode & 0xf000) == 0x8000)) {
            if (testDescriptions[iVar3].suffix == (char *)0x0) {
              pcVar6 = (char *)0x0;
            }
            else {
              pcVar9 = gStack_140.gl_pathv[uVar13];
              pcVar11 = testDescriptions[iVar3].out;
              pcStack_168 = (code *)0x102708;
              pcVar6 = resultFilename(pcVar9,pcVar11,testDescriptions[iVar3].suffix);
              if (pcVar6 == (char *)0x0) {
                pcStack_168 = (code *)0x10299f;
                runtest_cold_1();
                goto LAB_0010299f;
              }
            }
            if (testDescriptions[iVar3].err == (char *)0x0) {
              unaff_R14 = (char *)0x0;
            }
            else {
              pcVar9 = gStack_140.gl_pathv[uVar13];
              pcVar11 = testDescriptions[iVar3].out;
              pcStack_168 = (code *)0x102732;
              unaff_R14 = resultFilename(pcVar9,pcVar11,testDescriptions[iVar3].err);
              if (unaff_R14 == (char *)0x0) {
LAB_0010299f:
                pcStack_168 = testExternalEntityLoader;
                runtest_cold_2();
                uStack_180 = uVar13;
                pcStack_178 = unaff_R14;
                psStack_170 = &sStack_f8;
                pcStack_168 = (code *)pcVar6;
                iVar2 = stat64(pcVar9,&sStack_210);
                if ((iVar2 != -1) && ((sStack_210.st_mode & 0xf000) == 0x8000)) {
                  iVar2 = xmlNoNetExternalEntityLoader(pcVar9,pcVar11,extraout_RDX);
                  return iVar2;
                }
                iVar2 = xmlMemUsed();
                iVar3 = xmlNoNetExternalEntityLoader(pcVar9,pcVar11,extraout_RDX);
                iVar4 = xmlMemUsed();
                extraMemoryFromResolver = extraMemoryFromResolver + (iVar4 - iVar2);
                return iVar3;
              }
            }
            if (pcVar6 == (char *)0x0) {
LAB_00102770:
              if (unaff_R14 != (char *)0x0) {
                pcStack_168 = (code *)0x102780;
                iVar2 = stat64(unaff_R14,&sStack_f8);
                if ((iVar2 == -1) || ((sStack_f8.st_mode & 0xf000) != 0x8000)) {
                  pcVar11 = "Missing error file %s\n";
                  pcVar9 = unaff_R14;
                  goto LAB_001028eb;
                }
              }
              pcStack_168 = (code *)0x1027a3;
              iVar2 = xmlMemUsed();
              extraMemoryFromResolver = 0;
              testErrorsSize = 0;
              testErrors[0] = '\0';
              pcStack_168 = (code *)0x1027dc;
              iVar4 = (*testDescriptions[iVar3].func)
                                (gStack_140.gl_pathv[uVar13],pcVar6,unaff_R14,
                                 testDescriptions[iVar3].options | 0x10000);
              pcStack_168 = (code *)0x1027e4;
              xmlResetLastError();
              if (iVar4 == 0) {
                pcStack_168 = (code *)0x1027ee;
                iVar4 = xmlMemUsed();
                if (iVar4 != iVar2) {
                  pcStack_168 = (code *)0x1027ff;
                  iVar4 = xmlMemUsed();
                  __stream = _stderr;
                  if ((iVar4 != iVar2) && (extraMemoryFromResolver == 0)) {
                    pcStack_148 = gStack_140.gl_pathv[uVar13];
                    pcStack_168 = (code *)0x10282a;
                    iVar4 = xmlMemUsed();
                    pcStack_168 = (code *)0x102848;
                    fprintf(__stream,"File %s leaked %d bytes\n",pcStack_148,
                            (ulong)(uint)(iVar4 - iVar2));
                    piVar7 = &nb_leaks;
                    goto LAB_0010287c;
                  }
                }
              }
              else {
                pcStack_168 = (code *)0x102872;
                fprintf(_stderr,"File %s generated an error\n",gStack_140.gl_pathv[uVar13]);
                piVar7 = &nb_errors;
LAB_0010287c:
                *piVar7 = *piVar7 + 1;
                iStack_158 = iStack_158 + 1;
              }
              testErrorsSize = 0;
            }
            else {
              pcStack_168 = (code *)0x102752;
              iVar2 = stat64(pcVar6,&sStack_f8);
              if ((iVar2 != -1) && ((sStack_f8.st_mode & 0xf000) == 0x8000)) goto LAB_00102770;
              pcVar11 = "Missing result file %s\n";
              pcVar9 = pcVar6;
LAB_001028eb:
              pcStack_168 = (code *)0x1028f2;
              fprintf(_stderr,pcVar11,pcVar9);
            }
            if (pcVar6 != (char *)0x0) {
              pcStack_168 = (code *)0x1028a4;
              free(pcVar6);
            }
            if (unaff_R14 != (char *)0x0) {
              pcStack_168 = (code *)0x1028b1;
              free(unaff_R14);
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < gStack_140.gl_pathc);
      }
      pcStack_168 = (code *)0x1028fe;
      globfree64(&gStack_140);
      iVar2 = extraout_EAX;
    }
    if (verbose == '\x01') {
      if (nb_leaks == iStack_150 && nb_errors == iStack_14c) {
        pcStack_168 = (code *)0x102972;
        iVar2 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iStack_154));
      }
      else {
        pcStack_168 = (code *)0x102988;
        iVar2 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iStack_154),
                       (ulong)(uint)(nb_errors - iStack_14c),(ulong)(uint)(nb_leaks - iStack_150));
      }
    }
    return iVar2;
  }
  if (1 < argc) {
    iVar2 = 0;
    uVar13 = 1;
    do {
      pcVar6 = argv[uVar13];
      iVar3 = strcmp(pcVar6,"-v");
      puVar8 = &verbose;
      if (iVar3 == 0) {
LAB_0010258a:
        *puVar8 = 1;
      }
      else {
        iVar3 = strcmp(pcVar6,"-quiet");
        puVar8 = &tests_quiet;
        if (iVar3 == 0) goto LAB_0010258a;
        iVar3 = 0;
        ptVar12 = testDescriptions;
        do {
          pcVar6 = strstr(ptVar12->desc,argv[uVar13]);
          if (pcVar6 != (char *)0x0) {
            runtest(iVar3);
            iVar2 = iVar2 + 1;
          }
          iVar3 = iVar3 + 1;
          ptVar1 = ptVar12 + 1;
          ptVar12 = ptVar12 + 1;
        } while (ptVar1->func != (functest)0x0);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)argc);
    if (iVar2 != 0) goto LAB_001025ac;
  }
  lVar10 = 0;
  do {
    runtest((int)lVar10);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
LAB_001025ac:
  bVar14 = nb_errors != 0 || nb_leaks != 0;
  if (bVar14) {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return (uint)bVar14;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
	else {
	    for (i = 0; testDescriptions[i].func != NULL; i++) {
	        if (strstr(testDescriptions[i].desc, argv[a])) {
		    ret += runtest(i);
		    subset++;
		}
	    }
	}
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(ret);
}